

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
gtl::internal_btree::
btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>::
rebalance_left_to_right
          (btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
           *this,int to_move,
          btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
          *right,allocator_type *alloc)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  field_type fVar4;
  int iVar5;
  slot_type *dest;
  btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
  *pbVar6;
  btree_node<gtl::internal_btree::set_params<int,_std::less<int>,_std::allocator<int>,_256,_false>_>
  *pbVar7;
  template_ElementType<2L> *ptVar8;
  template_ElementType<2L> *ptVar9;
  template_ElementType<2L> *ptVar10;
  template_ElementType<1L> *ptVar11;
  uint i;
  slot_type *src;
  int iVar12;
  ulong local_48;
  template_ElementType<2L> *local_38;
  
  pbVar6 = parent(this);
  pbVar7 = parent(right);
  if (pbVar6 != pbVar7) {
    __assert_fail("parent() == right->parent()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                  ,0x627,
                  "void gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>]"
                 );
  }
  bVar1 = position(this);
  bVar2 = position(right);
  if (bVar1 + 1 != (uint)bVar2) {
    __assert_fail("position() + 1 == right->position()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                  ,0x628,
                  "void gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>]"
                 );
  }
  bVar1 = count(this);
  bVar2 = count(right);
  if (bVar1 < bVar2) {
    __assert_fail("count() >= right->count()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                  ,0x629,
                  "void gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>]"
                 );
  }
  if (0 < to_move) {
    bVar1 = count(this);
    if ((uint)to_move <= (uint)bVar1) {
      bVar1 = count(right);
      if ((uint)bVar1 < (uint)to_move) {
        bVar1 = count(right);
        uninitialized_move_n(right,(ulong)bVar1,0,(ulong)(uint)to_move,right,alloc);
        pbVar6 = parent(this);
        bVar1 = position(this);
        local_38 = btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                   ::GetField<2l>((btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                                   *)pbVar6);
        local_38 = local_38 + bVar1;
        btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
        ::
        value_init<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>::slot_type*>
                  ((btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                    *)right,(ulong)(to_move - 1U),alloc,&local_38);
        bVar1 = count(right);
        iVar5 = ~(uint)bVar1 + to_move;
        bVar1 = count(this);
        bVar2 = count(right);
        uninitialized_move_n(this,(long)iVar5,(ulong)bVar1 - (long)iVar5,(ulong)bVar2,right,alloc);
        bVar1 = count(this);
        ptVar8 = btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                 ::GetField<2l>((btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                                 *)this);
        bVar2 = count(this);
        ptVar9 = btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                 ::GetField<2l>((btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                                 *)this);
        ptVar10 = btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                  ::GetField<2l>((btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                                  *)right);
        for (ptVar8 = ptVar8 + (int)((uint)bVar1 - (to_move - 1U));
            ptVar8 != ptVar9 + (int)((uint)bVar2 - iVar5); ptVar8 = ptVar8 + 1) {
          ptVar10->value = ptVar8->value;
          ptVar10 = ptVar10 + 1;
        }
      }
      else {
        bVar1 = count(right);
        bVar2 = count(right);
        uninitialized_move_n
                  (right,(ulong)(uint)to_move,(long)(int)((uint)bVar1 - to_move),(ulong)bVar2,right,
                   alloc);
        bVar1 = count(right);
        ptVar8 = btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                 ::GetField<2l>((btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                                 *)right);
        bVar2 = count(right);
        ptVar9 = btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                 ::GetField<2l>((btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                                 *)right);
        ptVar10 = btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                  ::GetField<2l>((btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                                  *)right);
        ptVar9 = ptVar9 + ((ulong)bVar2 - 1);
        for (ptVar8 = ptVar8 + (int)(~to_move + (uint)bVar1); ptVar10 <= ptVar8;
            ptVar8 = ptVar8 + -1) {
          ptVar9->value = ptVar8->value;
          ptVar9 = ptVar9 + -1;
        }
        pbVar6 = parent(this);
        bVar1 = position(this);
        ptVar8 = btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                 ::GetField<2l>((btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                                 *)pbVar6);
        ptVar9 = btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                 ::GetField<2l>((btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                                 *)right);
        ptVar9[(long)to_move + -1].value = ptVar8[bVar1].value;
        bVar1 = count(this);
        ptVar8 = btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                 ::GetField<2l>((btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                                 *)this);
        bVar2 = count(this);
        ptVar9 = btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                 ::GetField<2l>((btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                                 *)this);
        ptVar10 = btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                  ::GetField<2l>((btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                                  *)right);
        for (ptVar8 = ptVar8 + (int)(((uint)bVar1 - to_move) + 1); ptVar8 != ptVar9 + bVar2;
            ptVar8 = ptVar8 + 1) {
          ptVar10->value = ptVar8->value;
          ptVar10 = ptVar10 + 1;
        }
      }
      local_48 = (ulong)(uint)to_move;
      bVar1 = count(this);
      ptVar8 = btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
               ::GetField<2l>((btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                               *)this);
      pbVar6 = parent(this);
      bVar2 = position(this);
      ptVar9 = btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
               ::GetField<2l>((btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                               *)pbVar6);
      ptVar9[bVar2].value = ptVar8[(int)((uint)bVar1 - to_move)].value;
      bVar1 = count(this);
      value_destroy_n(this,(long)(int)((uint)bVar1 - to_move),local_48,alloc);
      bVar3 = leaf(this);
      if (!bVar3) {
        bVar1 = count(right);
        for (i = (uint)bVar1; -1 < (int)i; i = i - 1) {
          pbVar6 = child(right,i);
          init_child(right,to_move + i,pbVar6);
          btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
          ::GetField<3l>((btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                          *)right);
        }
        iVar5 = 1;
        iVar12 = -to_move;
        while (iVar12 = iVar12 + 1, iVar12 != 1) {
          bVar1 = count(this);
          pbVar6 = child(this,(uint)bVar1 + iVar12);
          init_child(right,iVar5 + -1,pbVar6);
          count(this);
          btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
          ::GetField<3l>((btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                          *)this);
          iVar5 = iVar5 + 1;
        }
      }
      fVar4 = count(this);
      ptVar11 = btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                ::GetField<1l>((btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                                *)this);
      ptVar11[2] = fVar4 - (char)to_move;
      fVar4 = count(right);
      ptVar11 = btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                ::GetField<1l>((btree_node<gtl::internal_btree::set_params<int,std::less<int>,std::allocator<int>,256,false>>
                                *)right);
      ptVar11[2] = fVar4 + (char)to_move;
      return;
    }
    __assert_fail("to_move <= count()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                  ,0x62b,
                  "void gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>]"
                 );
  }
  __assert_fail("to_move >= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                ,0x62a,
                "void gtl::internal_btree::btree_node<gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>>::rebalance_left_to_right(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::set_params<int, std::less<int>, std::allocator<int>, 256, false>]"
               );
}

Assistant:

void btree_node<P>::rebalance_left_to_right(const int to_move,
                                            btree_node *right,
                                            allocator_type *alloc) {
  assert(parent() == right->parent());
  assert(position() + 1 == right->position());
  assert(count() >= right->count());
  assert(to_move >= 1);
  assert(to_move <= count());

  // Values in the right node are shifted to the right to make room for the
  // new to_move values. Then, the delimiting value in the parent and the
  // other (to_move - 1) values in the left node are moved into the right node.
  // Lastly, a new delimiting value is moved from the left node into the
  // parent, and the remaining empty left node entries are destroyed.

  if (right->count() >= to_move) {
    // The original location of the right->count() values are sufficient to hold
    // the new to_move entries from the parent and left node.

    // 1) Shift existing values in the right node to their correct positions.
    right->uninitialized_move_n(to_move, right->count() - to_move,
                                right->count(), right, alloc);
    for (slot_type *src = right->slot(right->count() - to_move - 1),
                   *dest = right->slot(right->count() - 1),
                   *end = right->slot(0);
         src >= end; --src, --dest) {
      slot_type::move(alloc, src, dest);
    }

    // 2) Move the delimiting value in the parent to the right node.
    slot_type::move(alloc, parent()->slot(position()),
                    right->slot(to_move - 1));

    // 3) Move the (to_move - 1) values from the left node to the right node.
    slot_type::move(alloc, slot(count() - (to_move - 1)), slot(count()),
                    right->slot(0));
  } else {
    // The right node does not have enough initialized space to hold the new
    // to_move entries, so part of them will move to uninitialized space.

    // 1) Shift existing values in the right node to their correct positions.
    right->uninitialized_move_n(right->count(), 0, to_move, right, alloc);

    // 2) Move the delimiting value in the parent to the right node.
    right->value_init(to_move - 1, alloc, parent()->slot(position()));

    // 3) Move the (to_move - 1) values from the left node to the right node.
    const size_type uninitialized_remaining = to_move - right->count() - 1;
    uninitialized_move_n(uninitialized_remaining,
                         count() - uninitialized_remaining, right->count(),
                         right, alloc);
    slot_type::move(alloc, slot(count() - (to_move - 1)),
                    slot(count() - uninitialized_remaining), right->slot(0));
  }

  // 4) Move the new delimiting value to the parent from the left node.
  slot_type::move(alloc, slot(count() - to_move), parent()->slot(position()));

  // 5) Destroy the now-empty to_move entries in the left node.
  value_destroy_n(count() - to_move, to_move, alloc);

  if (!leaf()) {
    // Move the child pointers from the left to the right node.
    for (int i = right->count(); i >= 0; --i) {
      right->init_child(i + to_move, right->child(i));
      right->clear_child(i);
    }
    for (int i = 1; i <= to_move; ++i) {
      right->init_child(i - 1, child(count() - to_move + i));
      clear_child(count() - to_move + i);
    }
  }

  // Fixup the counts on the left and right nodes.
  set_count(count() - to_move);
  right->set_count(right->count() + to_move);
}